

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_remove(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  
  pTVar1 = index2adr_stack(L,idx);
  while( true ) {
    pTVar2 = pTVar1 + 1;
    if (L->top <= pTVar2) break;
    *pTVar1 = *pTVar2;
    pTVar1 = pTVar2;
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_remove(lua_State *L, int idx)
{
  TValue *p = index2adr_stack(L, idx);
  while (++p < L->top) copyTV(L, p-1, p);
  L->top--;
}